

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  size_type this_00;
  auto_ptr<cmVariableWatch::Pair> aVar1;
  Pair *pPVar2;
  Pair *pPVar3;
  reference ppPVar4;
  Pair *local_78;
  undefined4 local_6c;
  value_type local_68;
  Pair *pair;
  size_type cc;
  VectorOfPairs *vp;
  auto_ptr<cmVariableWatch::Pair> local_40;
  auto_ptr<cmVariableWatch::Pair> p;
  DeleteData delete_data_local;
  void *client_data_local;
  WatchMethod method_local;
  string *variable_local;
  cmVariableWatch *this_local;
  
  p.x_ = (Pair *)delete_data;
  pPVar2 = (Pair *)operator_new(0x18);
  Pair::Pair(pPVar2);
  ::cm::auto_ptr<cmVariableWatch::Pair>::auto_ptr(&local_40,pPVar2);
  pPVar2 = ::cm::auto_ptr<cmVariableWatch::Pair>::operator->(&local_40);
  pPVar2->Method = method;
  pPVar2 = ::cm::auto_ptr<cmVariableWatch::Pair>::operator->(&local_40);
  aVar1 = p;
  pPVar2->ClientData = client_data;
  pPVar2 = ::cm::auto_ptr<cmVariableWatch::Pair>::operator->(&local_40);
  pPVar2->DeleteDataCall = (DeleteData)aVar1.x_;
  cc = (size_type)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
       ::operator[](&this->WatchMap,variable);
  pair = (Pair *)0x0;
  do {
    pPVar2 = pair;
    pPVar3 = (Pair *)std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                     ::size((vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                             *)cc);
    this_00 = cc;
    if (pPVar3 <= pPVar2) {
      local_78 = ::cm::auto_ptr<cmVariableWatch::Pair>::release(&local_40);
      std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::push_back
                ((vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_> *)
                 this_00,&local_78);
      this_local._7_1_ = true;
LAB_007271e9:
      local_6c = 1;
      ::cm::auto_ptr<cmVariableWatch::Pair>::~auto_ptr(&local_40);
      return this_local._7_1_;
    }
    ppPVar4 = std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::
              operator[]((vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                          *)cc,(size_type)pair);
    local_68 = *ppPVar4;
    if (((local_68->Method == method) && (client_data != (void *)0x0)) &&
       (client_data == local_68->ClientData)) {
      this_local._7_1_ = false;
      goto LAB_007271e9;
    }
    pair = (Pair *)((long)&pair->Method + 1);
  } while( true );
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable, WatchMethod method,
                               void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  CM_AUTO_PTR<cmVariableWatch::Pair> p(new cmVariableWatch::Pair);
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::size_type cc;
  for (cc = 0; cc < vp->size(); cc++) {
    cmVariableWatch::Pair* pair = (*vp)[cc];
    if (pair->Method == method && client_data &&
        client_data == pair->ClientData) {
      // Callback already exists
      return false;
    }
  }
  vp->push_back(p.release());
  return true;
}